

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::append(QString *this,QString *str)

{
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 b;
  long lVar1;
  QAnyStringView s;
  
  b = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(str->d).ptr;
  if ((char16_t *)b.m_data != (char16_t *)0x0) {
    if ((this->d).ptr == (char16_t *)0x0) {
      if ((str->d).d == (Data *)0x0) {
        s.m_size = (str->d).size | 0x8000000000000000;
        s.field_0.m_data_utf16 = (char16_t *)b.m_data;
        assign(this,s);
      }
      else {
        QArrayDataPointer<char16_t>::operator=(&this->d,&str->d);
      }
    }
    else {
      lVar1 = (str->d).size;
      if (lVar1 != 0) {
        QtPrivate::QCommonArrayOps<char16_t>::growAppend
                  ((QCommonArrayOps<char16_t> *)this,b.m_data_utf16,
                   (char16_t *)((long)b.m_data + lVar1 * 2));
        (this->d).ptr[(this->d).size] = L'\0';
      }
    }
  }
  return this;
}

Assistant:

QString &QString::append(const QString &str)
{
    if (!str.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!str.d.isMutable()))
                assign(str); // fromRawData, so we do a deep copy
            else
                operator=(str);
        } else if (str.size()) {
            append(str.constData(), str.size());
        }
    }
    return *this;
}